

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O1

void __thiscall
Sequence::process_cluster_list2
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,int i,
          Eqclass_SS *EQ,shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  int *piVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  pointer piVar6;
  Eqclass *pEVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Lists<std::shared_ptr<Eqclass>_> *this_00;
  element_type *peVar9;
  undefined8 uVar10;
  uint uVar11;
  element_type *peVar12;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar13;
  pointer psVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  element_type *peVar16;
  element_type *peVar17;
  bool bVar18;
  Itemset_S mjoin;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  Itemset_S ejoin;
  Itemset_S ljoin;
  long local_f0;
  undefined1 local_e8 [52];
  int msup;
  int esup;
  int lsup;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  shared_ptr<Eqclass> local_a0;
  Eqclass_S local_90;
  Itemset_S local_80;
  Itemset_S local_70;
  Itemset_S local_60;
  element_type *local_50;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_48;
  
  local_e8._32_8_ = this->env;
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (hdr1->super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_e8._28_4_ = i;
  local_50 = (element_type *)LargeL;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(hdr1->
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  if (hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    peVar16 = (element_type *)(long)(int)local_e8._28_4_;
    local_e8._40_8_ = SEXT48(iter + -1);
    local_f0 = (long)peVar16 << 4;
    peVar12 = peVar16;
    local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1;
    do {
      peVar4 = hdr2.
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar2 = (EQ->
               super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      psVar14 = (peVar2->
                super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((element_type *)
          ((long)(peVar2->
                 super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   peVar12);
      }
      peVar3 = ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->_vptr__Sp_counted_base)->
               _M_ptr;
      uVar11 = Eqclass::templ(*(Eqclass **)
                               ((long)&psVar14->
                                       super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> +
                               local_f0));
      prune_decision((Sequence *)local_e8,(Itemset_S *)this,&peVar3->theItem,(int)peVar4 + 0x10,
                     uVar11);
      uVar10 = local_e8._8_8_;
      ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8._0_8_;
      _Var15 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_e8._0_8_ = (Env *)0x0;
      local_e8._8_8_ = (element_type *)0x0;
      ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
      if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
      }
      if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      peVar3 = hdr2.
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      _Var15._M_pi = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      peVar4 = ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->_vptr__Sp_counted_base)->
               _M_ptr;
      if (hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == peVar4) {
        mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
        ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)_Var15._M_pi,
                   &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     peVar16);
        }
        uVar11 = Eqclass::templ2(psVar14[(long)peVar16].
                                 super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        prune_decision((Sequence *)local_e8,(Itemset_S *)this,&peVar3->theItem,(int)peVar4 + 0x10,
                       uVar11);
        uVar10 = local_e8._8_8_;
        ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_e8._0_8_;
        _Var15 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_e8._0_8_ = (Env *)0x0;
        local_e8._8_8_ = (element_type *)0x0;
        ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
        if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
        if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
        }
        peVar4 = hdr2.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     peVar16);
        }
        peVar3 = ((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 &(local_a8._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
        uVar11 = Eqclass::templ(psVar14[(long)peVar16].
                                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        prune_decision((Sequence *)local_e8,(Itemset_S *)this,&peVar4->theItem,(int)peVar3 + 0x10,
                       uVar11);
        uVar10 = local_e8._8_8_;
        mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_e8._0_8_;
        _Var15 = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        local_e8._0_8_ = (Env *)0x0;
        local_e8._8_8_ = (element_type *)0x0;
        mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
        if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
        }
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
        hdr1 = (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)local_a8._M_pi;
        if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          hdr1 = (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)local_a8._M_pi;
        }
      }
      msup = 0;
      esup = 0;
      lsup = 0;
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar16;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
        goto LAB_0010a3e4;
        uVar11 = Eqclass::templ2(psVar14[(long)peVar16].
                                 super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pre_pruning(this,&ejoin,uVar11,
                    &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                          _vptr__Sp_counted_base)->_M_ptr->theItem,
                    &(hdr2.
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->theItem,'\0');
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar12;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar12)
        goto LAB_0010a3e4;
        uVar11 = Eqclass::templ(*(Eqclass **)
                                 ((long)&psVar14->
                                         super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> +
                                 local_f0));
        pre_pruning(this,&ljoin,uVar11,
                    &(hdr2.
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->theItem,
                    &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                          _vptr__Sp_counted_base)->_M_ptr->theItem,'\x01');
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar16;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
        goto LAB_0010a3e4;
        uVar11 = Eqclass::templ(psVar14[(long)peVar16].
                                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        pre_pruning(this,&mjoin,uVar11,
                    &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                          _vptr__Sp_counted_base)->_M_ptr->theItem,
                    &(hdr2.
                      super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->theItem,'\x01');
      }
      if (((ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) ||
          (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0)) ||
         (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        get_tmpnewf_intersect
                  (this,&ljoin,&ejoin,&mjoin,&lsup,&esup,&msup,
                   &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                         _vptr__Sp_counted_base)->_M_ptr->theItem,
                   &(hdr2.
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->theItem,iter);
      }
      if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        fill_join((Sequence *)_Var15._M_pi,&ljoin,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,
                  &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                        _vptr__Sp_counted_base)->_M_ptr->theItem);
      }
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar12;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar12)
        goto LAB_0010a3e4;
        uVar11 = Eqclass::templ(*(Eqclass **)
                                 ((long)&psVar14->
                                         super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> +
                                 local_f0));
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        post_pruning(this,&ljoin,uVar11);
      }
      peVar9 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        peVar5 = (this->numLargeItemset).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar6 = (peVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        peVar17 = (element_type *)local_e8._40_8_;
        if ((element_type *)
            ((long)(peVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar6 >> 2) <= (ulong)local_e8._40_8_)
        goto LAB_0010a3e4;
        piVar1 = piVar6 + local_e8._40_8_;
        *piVar1 = *piVar1 + 1;
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          peVar2 = (EQ->
                   super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          psVar14 = (peVar2->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          peVar17 = peVar12;
          if ((element_type *)
              ((long)(peVar2->
                     super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar12)
          goto LAB_0010a3e4;
          uVar11 = Eqclass::templ(*(Eqclass **)
                                   ((long)&psVar14->
                                           super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> +
                                   local_f0));
          Itemset::print_seq(peVar9,(ostream *)local_e8._32_8_,uVar11);
        }
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar12;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar12)
        goto LAB_0010a3e4;
        pEVar7 = *(Eqclass **)
                  ((long)&psVar14->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> +
                  local_f0);
        local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Eqclass::append(pEVar7,&local_60);
        _Var15._M_pi = local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
        if ((element_type *)
            local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        fill_join((Sequence *)_Var15._M_pi,&ejoin,
                  &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                        _vptr__Sp_counted_base)->_M_ptr->theItem,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem);
      }
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar16;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
        goto LAB_0010a3e4;
        uVar11 = Eqclass::templ2(psVar14[(long)peVar16].
                                 super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
        post_pruning(this,&ejoin,uVar11);
      }
      peVar9 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        peVar5 = (this->numLargeItemset).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar6 = (peVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        peVar17 = (element_type *)local_e8._40_8_;
        if ((element_type *)
            ((long)(peVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar6 >> 2) <= (ulong)local_e8._40_8_)
        goto LAB_0010a3e4;
        piVar1 = piVar6 + local_e8._40_8_;
        *piVar1 = *piVar1 + 1;
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          peVar2 = (EQ->
                   super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          psVar14 = (peVar2->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          peVar17 = peVar16;
          if ((element_type *)
              ((long)(peVar2->
                     super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
          goto LAB_0010a3e4;
          uVar11 = Eqclass::templ2(psVar14[(long)peVar16].
                                   super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          Itemset::print_seq(peVar9,(ostream *)local_e8._32_8_,uVar11);
        }
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar16;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
        goto LAB_0010a3e4;
        pEVar7 = psVar14[(long)peVar16].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Eqclass::append2(pEVar7,&local_70);
        _Var15._M_pi = local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
        if ((element_type *)
            local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        fill_join((Sequence *)_Var15._M_pi,&mjoin,
                  &((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hdr1)->
                        _vptr__Sp_counted_base)->_M_ptr->theItem,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem);
      }
      if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              pruning_type) {
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar16;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
        goto LAB_0010a3e4;
        uVar11 = Eqclass::templ(psVar14[(long)peVar16].
                                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        post_pruning(this,&mjoin,uVar11);
      }
      peVar9 = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        peVar5 = (this->numLargeItemset).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar6 = (peVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        peVar17 = (element_type *)local_e8._40_8_;
        if ((element_type *)
            ((long)(peVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar6 >> 2) <= (ulong)local_e8._40_8_)
        goto LAB_0010a3e4;
        piVar1 = piVar6 + local_e8._40_8_;
        *piVar1 = *piVar1 + 1;
        if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            outputfreq != '\0') {
          peVar2 = (EQ->
                   super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          psVar14 = (peVar2->
                    super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          peVar17 = peVar16;
          if ((element_type *)
              ((long)(peVar2->
                     super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
          goto LAB_0010a3e4;
          uVar11 = Eqclass::templ(psVar14[(long)peVar16].
                                  super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          Itemset::print_seq(peVar9,(ostream *)local_e8._32_8_,uVar11);
        }
        peVar2 = (EQ->
                 super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        psVar14 = (peVar2->
                  super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        peVar17 = peVar16;
        if ((element_type *)
            ((long)(peVar2->
                   super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar16)
        goto LAB_0010a3e4;
        pEVar7 = psVar14[(long)peVar16].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_80.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_80.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Eqclass::append(pEVar7,&local_80);
        if (local_80.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      _Var15._M_pi = hdr2.
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      peVar4 = ((hdr2.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->theNext).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var8 = ((hdr2.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->theNext).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      bVar18 = hdr2.
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var8;
      if (bVar18) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
      }
      local_f0 = local_f0 + 0x10;
      peVar12 = (element_type *)&peVar12->field_0x1;
    } while (hdr2.
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != (element_type *)0x0);
  }
  peVar2 = (EQ->
           super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar17 = (element_type *)(long)(int)local_e8._28_4_;
  psVar14 = (peVar2->
            super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((element_type *)
      ((long)(peVar2->
             super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar17)
  goto LAB_0010a3e4;
  psVar13 = Eqclass::list(psVar14[(long)peVar17].
                          super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (((psVar13->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->theSize < 1) {
    peVar2 = (EQ->
             super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    psVar14 = (peVar2->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((element_type *)
        ((long)(peVar2->
               super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar17)
    goto LAB_0010a3e4;
    psVar13 = Eqclass::list2(psVar14[(long)peVar17].
                             super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (0 < ((psVar13->
             super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->theSize) goto LAB_0010a1e1;
    peVar2 = (EQ->
             super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    psVar14 = (peVar2->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((element_type *)
        ((long)(peVar2->
               super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar17) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",peVar17
                );
    }
  }
  else {
LAB_0010a1e1:
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recursive == 0) {
      peVar2 = (EQ->
               super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      psVar14 = (peVar2->
                super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((element_type *)
          ((long)(peVar2->
                 super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar17)
      goto LAB_0010a3e4;
      this_00 = (Lists<std::shared_ptr<Eqclass>_> *)
                (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar14[(long)peVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar14 + (long)peVar17) + 8);
      if (local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Lists<std::shared_ptr<Eqclass>_>::append(this_00,&local_a0);
      _Var15._M_pi = local_a0.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
      goto LAB_0010a359;
    }
    peVar2 = (EQ->
             super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    psVar14 = (peVar2->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((element_type *)
        ((long)(peVar2->
               super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar17) {
LAB_0010a3e4:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",peVar17
                );
    }
    local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar14[(long)peVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar14 + (long)peVar17) + 8);
    if (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    process_cluster1(this,&local_90,&local_48,iter + 1);
    if (local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
    peVar2 = (EQ->
             super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    psVar14 = (peVar2->
              super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((element_type *)
        ((long)(peVar2->
               super__Vector_base<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14 >> 4) <= peVar17) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",peVar17
                );
    }
  }
  _Var15._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)(psVar14 + (long)peVar17) + 8);
  psVar14[(long)peVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&psVar14[(long)peVar17].super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0010a359:
  if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
  }
  if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (hdr2.
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Sequence::process_cluster_list2(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1, int i, Eqclass_SS& EQ,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int j;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;

    //join with sequences
    hdr2 = hdr1;
    for (j = i; hdr2; j++, hdr2 = hdr2->next()) {
        ljoin = prune_decision(hdr1->item(), hdr2->item(), EQ->at(j)->templ(), LJOIN);
        if (hdr2 == hdr1) {
            ejoin = mjoin = nullptr;
        } else {
            ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ2(), EJOIN);
            mjoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ(), MJOIN);
            //ejoin = mjoin = (Itemset_S )1;
        }
        lsup = esup = msup = 0;
        if (args->pruning_type > 1) {
            pre_pruning(ejoin, EQ->at(i)->templ2(), hdr1->item(), hdr2->item(), 0);
            pre_pruning(ljoin, EQ->at(j)->templ(), hdr2->item(), hdr1->item(), 1);
            pre_pruning(mjoin, EQ->at(i)->templ(), hdr1->item(), hdr2->item(), 1);
        }

        if (ljoin || ejoin || mjoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr1->item(), hdr2->item(), iter);
        if (ljoin) fill_join(ljoin, hdr2->item(), hdr1->item());
        if (args->pruning_type > 1) post_pruning(ljoin, EQ->at(j)->templ());
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr2->item(), hdr1->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->at(j)->templ());
            EQ->at(j)->append(ljoin);
        }

        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->at(i)->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->at(i)->templ2());
            EQ->at(i)->append2(ejoin);
        }

        if (mjoin) fill_join(mjoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(mjoin, EQ->at(i)->templ());
        if (mjoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(mjoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) mjoin->print_seq(seqstrm, EQ->at(i)->templ());
            EQ->at(i)->append(mjoin);
        }
    }
    if ((EQ->at(i)->list()->size() > 0) || (EQ->at(i)->list2()->size() > 0)) {
        if (args->recursive) {
            //if (use_hash) insert_freqarray(EQ->at(i));
            process_cluster1(EQ->at(i), nullptr, iter + 1);
            EQ->at(i) = nullptr;
        } else LargeL->append(EQ->at(i));
    } else {
        EQ->at(i) = nullptr;
    }

}